

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_oload(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  OBJ_INDEX_DATA *pOVar5;
  CHAR_DATA *ch_00;
  long in_RDI;
  int level;
  OBJ_DATA *obj;
  OBJ_INDEX_DATA *pObjIndex;
  char arg2 [4608];
  char arg1 [4608];
  CHAR_DATA *in_stack_ffffffffffffdbb8;
  OBJ_DATA *in_stack_ffffffffffffdbc0;
  CHAR_DATA *in_stack_ffffffffffffdbc8;
  int in_stack_ffffffffffffdbd0;
  undefined4 in_stack_ffffffffffffdbd4;
  char local_2418 [132];
  int in_stack_ffffffffffffdc6c;
  OBJ_INDEX_DATA *in_stack_ffffffffffffdc70;
  char local_1218 [36];
  int in_stack_ffffffffffffee0c;
  long in_stack_ffffffffffffee10;
  long in_stack_ffffffffffffee18;
  OBJ_DATA *in_stack_ffffffffffffee20;
  CHAR_DATA *in_stack_ffffffffffffee28;
  char *in_stack_ffffffffffffee30;
  
  one_argument((char *)in_stack_ffffffffffffdbc0,(char *)in_stack_ffffffffffffdbb8);
  one_argument((char *)in_stack_ffffffffffffdbc0,(char *)in_stack_ffffffffffffdbb8);
  if ((local_1218[0] == '\0') || (bVar1 = is_number((char *)in_stack_ffffffffffffdbb8), !bVar1)) {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffdbd4,in_stack_ffffffffffffdbd0),
                 in_stack_ffffffffffffdbc8);
    return;
  }
  iVar2 = get_trust(in_stack_ffffffffffffdbb8);
  iVar3 = in_stack_ffffffffffffdbd0;
  if (local_2418[0] != '\0') {
    bVar1 = is_number((char *)in_stack_ffffffffffffdbb8);
    if (!bVar1) {
      send_to_char((char *)CONCAT44(iVar2,in_stack_ffffffffffffdbd0),in_stack_ffffffffffffdbc8);
      return;
    }
    iVar3 = atoi(local_2418);
    iVar2 = iVar3;
    if ((iVar3 < 0) ||
       (iVar4 = get_trust(in_stack_ffffffffffffdbb8), in_stack_ffffffffffffdbd0 = iVar3,
       iVar4 < iVar3)) {
      send_to_char((char *)CONCAT44(iVar2,in_stack_ffffffffffffdbd0),in_stack_ffffffffffffdbc8);
      return;
    }
  }
  atoi(local_1218);
  pOVar5 = get_obj_index((int)((ulong)in_stack_ffffffffffffdbc8 >> 0x20));
  if (pOVar5 == (OBJ_INDEX_DATA *)0x0) {
    send_to_char((char *)CONCAT44(iVar2,iVar3),in_stack_ffffffffffffdbc8);
  }
  else {
    ch_00 = (CHAR_DATA *)create_object(in_stack_ffffffffffffdc70,in_stack_ffffffffffffdc6c);
    bVar1 = can_wear((OBJ_DATA *)in_stack_ffffffffffffdbc8,
                     (int)((ulong)in_stack_ffffffffffffdbc0 >> 0x20));
    if (bVar1) {
      obj_to_char(in_stack_ffffffffffffdbc0,in_stack_ffffffffffffdbb8);
    }
    else {
      obj_to_room((OBJ_DATA *)ch_00,*(ROOM_INDEX_DATA **)(in_RDI + 0xa8));
    }
    act((char *)CONCAT44(iVar2,iVar3),in_stack_ffffffffffffdbc8,in_stack_ffffffffffffdbc0,
        in_stack_ffffffffffffdbb8,0);
    get_trust(in_stack_ffffffffffffdbb8);
    wiznet(in_stack_ffffffffffffee30,in_stack_ffffffffffffee28,in_stack_ffffffffffffee20,
           in_stack_ffffffffffffee18,in_stack_ffffffffffffee10,in_stack_ffffffffffffee0c);
    send_to_char((char *)CONCAT44(iVar2,iVar3),ch_00);
  }
  return;
}

Assistant:

void do_oload(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH], arg2[MAX_INPUT_LENGTH];
	OBJ_INDEX_DATA *pObjIndex;
	OBJ_DATA *obj;
	int level;

	argument = one_argument(argument, arg1);
	one_argument(argument, arg2);

	if (arg1[0] == '\0' || !is_number(arg1))
	{
		send_to_char("Syntax: load obj <vnum> <level>.\n\r", ch);
		return;
	}

	level = get_trust(ch); /* default */

	if (arg2[0] != '\0') /* load with a level */
	{
		if (!is_number(arg2))
		{
			send_to_char("Syntax: oload <vnum> <level>.\n\r", ch);
			return;
		}

		level = atoi(arg2);

		if (level < 0 || level > get_trust(ch))
		{
			send_to_char("Level must be be between 0 and your level.\n\r", ch);
			return;
		}
	}

	pObjIndex = get_obj_index(atoi(arg1));

	if (pObjIndex == nullptr)
	{
		send_to_char("No object has that vnum.\n\r", ch);
		return;
	}

	obj = create_object(pObjIndex, level);

	if (can_wear(obj, ITEM_TAKE))
		obj_to_char(obj, ch);
	else
		obj_to_room(obj, ch->in_room);

	act("$n has created $p!", ch, obj, nullptr, ch->invis_level > 50 ? TO_IMMINROOM : TO_ROOM);

	wiznet("$N loads $p.", ch, obj, WIZ_LOAD, WIZ_SECURE, get_trust(ch));
	send_to_char("Ok.\n\r", ch);
}